

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::CopyInvertSSBOCase::iterate(CopyInvertSSBOCase *this)

{
  uint *puVar1;
  size_type *this_00;
  deUint32 *this_01;
  RenderContext *renderCtx;
  ContextType type;
  GLSLVersion version;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  GLenum GVar5;
  char *pcVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  ProgramSources *sources;
  TestError *pTVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  allocator<char> local_501;
  vector<unsigned_int,_std::allocator<unsigned_int>_> inputValues;
  uint local_4e4;
  BufferMemMap bufMap;
  Buffer outputBuffer;
  Buffer inputBuffer;
  BufferMemMap bufMap_1;
  InterfaceBlockInfo blockInfo;
  string local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  ShaderProgram program;
  Random rnd;
  GLuint local_2fc;
  uint local_2f8;
  uint local_2f0;
  uint local_2ec;
  int local_2e8;
  ostringstream src;
  Functions *gl;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar6 = glu::getGLSLVersionDeclaration(version);
  poVar7 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,pcVar6);
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"layout (local_size_x = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->m_localSize).m_data[0]);
  poVar7 = std::operator<<(poVar7,", local_size_y = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->m_localSize).m_data[1]);
  poVar7 = std::operator<<(poVar7,", local_size_z = ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(this->m_localSize).m_data[2]);
  poVar7 = std::operator<<(poVar7,") in;\n");
  poVar7 = std::operator<<(poVar7,"layout(binding = 0) buffer Input {\n");
  poVar7 = std::operator<<(poVar7,"    uint values[");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->m_numValues);
  poVar7 = std::operator<<(poVar7,"];\n");
  poVar7 = std::operator<<(poVar7,"} sb_in;\n");
  poVar7 = std::operator<<(poVar7,"layout (binding = 1) buffer Output {\n");
  poVar7 = std::operator<<(poVar7,"    uint values[");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->m_numValues);
  poVar7 = std::operator<<(poVar7,"];\n");
  poVar7 = std::operator<<(poVar7,"} sb_out;\n");
  poVar7 = std::operator<<(poVar7,"void main (void) {\n");
  poVar7 = std::operator<<(poVar7,
                           "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n");
  poVar7 = std::operator<<(poVar7,
                           "    uint numValuesPerInv = uint(sb_in.values.length()) / (size.x*size.y*size.z);\n"
                          );
  poVar7 = std::operator<<(poVar7,
                           "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
                          );
  poVar7 = std::operator<<(poVar7,"    uint offset          = numValuesPerInv*groupNdx;\n");
  poVar7 = std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<(poVar7,"    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n");
  poVar7 = std::operator<<(poVar7,
                           "        sb_out.values[offset + ndx] = ~sb_in.values[offset + ndx];\n");
  std::operator<<(poVar7,"}\n");
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&rnd,0,0xac);
  std::__cxx11::stringbuf::str();
  this_00 = &blockInfo.name._M_string_length;
  blockInfo.name._M_dataplus._M_p._0_4_ = 5;
  std::__cxx11::string::string((string *)this_00,(string *)&bufMap);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&rnd,(ShaderSource *)&blockInfo);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&bufMap);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&rnd);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&inputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&outputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&inputValues,(long)this->m_numValues,(allocator_type *)&rnd);
  deRandom_init(&rnd.m_rnd,0x124fef);
  for (lVar12 = 0;
      lVar12 < (int)((ulong)((long)inputValues.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)inputValues.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2);
      lVar12 = lVar12 + 1) {
    dVar3 = deRandom_getUint32(&rnd.m_rnd);
    inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[lVar12] = dVar3;
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk == false) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x122);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  rnd.m_rnd._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_01 = &rnd.m_rnd.z;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  std::operator<<((ostream *)this_01,"Work groups: ");
  tcu::operator<<((ostream *)this_01,&this->m_workSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&rnd,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  (*gl->useProgram)(program.m_program.m_program);
  GVar4 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Input");
  glu::getProgramInterfaceBlockInfo(&blockInfo,gl,program.m_program.m_program,0x92e6,GVar4);
  GVar4 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e5,"Input.values");
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&rnd,gl,program.m_program.m_program,0x92e5,GVar4);
  (*gl->bindBuffer)(0x90d2,inputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(ulong)blockInfo.dataSize,(void *)0x0,0x88e4);
  if (local_2f0 !=
      (uint)((ulong)((long)inputValues.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)inputValues.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2)) {
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,(char *)0x0,"valueInfo.arraySize == (deUint32)inputValues.size()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x132);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  BufferMemMap::BufferMemMap(&bufMap,gl,0x90d2,0,blockInfo.dataSize,2);
  for (uVar9 = 0;
      ((ulong)((long)inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
              (long)inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff) != uVar9;
      uVar9 = uVar9 + 1) {
    *(uint *)((long)bufMap.m_ptr + (ulong)(uint)(local_2e8 * (int)uVar9) + (ulong)local_2ec) =
         inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[uVar9];
  }
  BufferMemMap::~BufferMemMap(&bufMap);
  (*gl->bindBufferBase)(0x90d2,blockInfo.bufferBinding,inputBuffer.super_ObjectWrapper.m_object);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Input buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x13c);
  std::__cxx11::string::~string((string *)&rnd);
  glu::InterfaceBlockInfo::~InterfaceBlockInfo(&blockInfo);
  GVar4 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Output");
  glu::getProgramInterfaceBlockInfo
            ((InterfaceBlockInfo *)&rnd,gl,program.m_program.m_program,0x92e6,GVar4);
  (*gl->bindBuffer)(0x90d2,outputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(ulong)local_2f8,(void *)0x0,0x88e1);
  (*gl->bindBufferBase)(0x90d2,local_2fc,outputBuffer.super_ObjectWrapper.m_object);
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x147);
  glu::InterfaceBlockInfo::~InterfaceBlockInfo((InterfaceBlockInfo *)&rnd);
  (*gl->dispatchCompute)
            ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],(this->m_workSize).m_data[2])
  ;
  GVar5 = (*gl->getError)();
  glu::checkError(GVar5,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x14c);
  GVar4 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Output");
  dVar3 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e6,GVar4,0x9303);
  GVar4 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e5,"Output.values");
  glu::getProgramInterfaceVariableInfo
            ((InterfaceVariableInfo *)&rnd,gl,program.m_program.m_program,0x92e5,GVar4);
  BufferMemMap::BufferMemMap(&bufMap_1,gl,0x90d2,0,dVar3,1);
  if (local_2f0 ==
      (uint)((ulong)((long)inputValues.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)inputValues.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2)) {
    uVar10 = 0;
    uVar9 = 0;
    do {
      local_4e4 = (uint)uVar9;
      if (local_2f0 == uVar9) {
        BufferMemMap::~BufferMemMap(&bufMap_1);
        std::__cxx11::string::~string((string *)&rnd);
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_PASS,"Pass");
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  (&inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
        glu::ObjectWrapper::~ObjectWrapper(&outputBuffer.super_ObjectWrapper);
        glu::ObjectWrapper::~ObjectWrapper(&inputBuffer.super_ObjectWrapper);
        glu::ShaderProgram::~ShaderProgram(&program);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
        return STOP;
      }
      uVar11 = (ulong)uVar10;
      puVar1 = inputValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + uVar9;
      uVar9 = uVar9 + 1;
      uVar10 = uVar10 + local_2e8;
    } while ((*puVar1 ^ *(uint *)((long)bufMap_1.m_ptr + uVar11 + local_2ec)) == 0xffffffff);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_410,"Comparison failed for Output.values[",&local_501);
    de::toString<unsigned_int>(&local_430,&local_4e4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bufMap,
                   &local_410,&local_430);
    std::operator+(&blockInfo.name,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bufMap,"]")
    ;
    tcu::TestError::TestError(pTVar8,&blockInfo.name);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,(char *)0x0,"valueInfo.arraySize == (deUint32)inputValues.size()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
             ,0x156);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const GLSLVersion	glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream	src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Input {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_in;\n"
			<< "layout (binding = 1) buffer Output {\n"
			<< "    uint values[" << m_numValues << "];\n"
			<< "} sb_out;\n"
			<< "void main (void) {\n"
			<< "    uvec3 size           = gl_NumWorkGroups * gl_WorkGroupSize;\n"
			<< "    uint numValuesPerInv = uint(sb_in.values.length()) / (size.x*size.y*size.z);\n"
			<< "    uint groupNdx        = size.x*size.y*gl_GlobalInvocationID.z + size.x*gl_GlobalInvocationID.y + gl_GlobalInvocationID.x;\n"
			<< "    uint offset          = numValuesPerInv*groupNdx;\n"
			<< "\n"
			<< "    for (uint ndx = 0u; ndx < numValuesPerInv; ndx++)\n"
			<< "        sb_out.values[offset + ndx] = ~sb_in.values[offset + ndx];\n"
			<< "}\n";

		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));
		const Buffer				inputBuffer		(m_context.getRenderContext());
		const Buffer				outputBuffer	(m_context.getRenderContext());
		std::vector<deUint32>		inputValues		(m_numValues);

		// Compute input values.
		{
			de::Random rnd(0x124fef);
			for (int ndx = 0; ndx < (int)inputValues.size(); ndx++)
				inputValues[ndx] = rnd.getUint32();
		}

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Input buffer setup
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Input");
			const InterfaceBlockInfo	blockInfo	= getProgramInterfaceBlockInfo(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Input.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *inputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, (glw::GLsizeiptr)blockInfo.dataSize, DE_NULL, GL_STATIC_DRAW);

			TCU_CHECK(valueInfo.arraySize == (deUint32)inputValues.size());

			{
				const BufferMemMap bufMap(gl, GL_SHADER_STORAGE_BUFFER, 0, (int)blockInfo.dataSize, GL_MAP_WRITE_BIT);

				for (deUint32 ndx = 0; ndx < (deUint32)inputValues.size(); ndx++)
					*(deUint32*)((deUint8*)bufMap.getPtr() + valueInfo.offset + ndx*valueInfo.arrayStride) = inputValues[ndx];
			}

			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, blockInfo.bufferBinding, *inputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Input buffer setup failed");
		}

		// Output buffer setup
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const InterfaceBlockInfo	blockInfo	= getProgramInterfaceBlockInfo(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockInfo.dataSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, blockInfo.bufferBinding, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			TCU_CHECK(valueInfo.arraySize == (deUint32)inputValues.size());
			for (deUint32 ndx = 0; ndx < valueInfo.arraySize; ndx++)
			{
				const deUint32	res		= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*ndx));
				const deUint32	ref		= ~inputValues[ndx];

				if (res != ref)
					throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(ndx) + "]");
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}